

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doc_comment.cc
# Opt level: O3

void google::protobuf::compiler::java::WriteMessageDocComment
               (Printer *printer,Descriptor *message,Options *options,bool kdoc)

{
  pointer pcVar1;
  char *pcVar2;
  Options options_00;
  bool bVar3;
  undefined7 in_register_00000009;
  char *pcVar4;
  java *pjVar5;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view input;
  string_view input_00;
  SourceLocation location;
  undefined4 uVar6;
  undefined2 uVar7;
  undefined2 in_stack_fffffffffffffece;
  undefined1 *puVar8;
  long in_stack_fffffffffffffed8;
  long in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  undefined1 *puVar9;
  long in_stack_fffffffffffffef8;
  long in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff08;
  undefined2 uVar10;
  undefined2 in_stack_ffffffffffffff12;
  undefined4 in_stack_ffffffffffffff14;
  undefined1 local_e8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  _Alloc_hider local_b8;
  size_type local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  undefined4 local_80;
  undefined2 local_7c;
  long *local_78 [2];
  long local_68 [2];
  long *local_58 [2];
  long local_48 [2];
  undefined2 local_38;
  
  pcVar4 = (char *)CONCAT71(in_register_00000009,kdoc);
  text._M_str = "/**\n";
  text._M_len = 4;
  io::Printer::Print<>(printer,text);
  uVar7._0_1_ = options->opensource_runtime;
  uVar7._1_1_ = options->annotate_code;
  uVar6._0_1_ = options->generate_immutable_code;
  uVar6._1_1_ = options->generate_mutable_code;
  uVar6._2_1_ = options->generate_shared_code;
  uVar6._3_1_ = options->enforce_lite;
  puVar8 = &stack0xfffffffffffffee0;
  pcVar1 = (options->annotation_list_file)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xfffffffffffffed0,pcVar1,
             pcVar1 + (options->annotation_list_file)._M_string_length);
  puVar9 = &stack0xffffffffffffff00;
  pcVar1 = (options->output_list_file)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xfffffffffffffef0,pcVar1,
             pcVar1 + (options->output_list_file)._M_string_length);
  uVar10._0_1_ = options->strip_nonfunctional_codegen;
  uVar10._1_1_ = options->jvm_dsl;
  local_e8._24_8_ = 0;
  local_c8._M_local_buf[0] = '\0';
  local_b0 = 0;
  local_a8._M_local_buf[0] = '\0';
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8._16_8_ = &local_c8;
  local_b8._M_p = (pointer)&local_a8;
  bVar3 = Descriptor::GetSourceLocation(message,(SourceLocation *)local_e8);
  if (bVar3) {
    local_78[0] = local_68;
    local_80 = uVar6;
    local_7c = uVar7;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_78,puVar8,puVar8 + in_stack_fffffffffffffed8);
    local_58[0] = local_48;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_58,puVar9,puVar9 + in_stack_fffffffffffffef8);
    pcVar4 = (char *)(ulong)kdoc;
    options_00.opensource_runtime = (bool)(char)uVar7;
    options_00.annotate_code = (bool)(char)((ushort)uVar7 >> 8);
    options_00.generate_immutable_code = (bool)(char)uVar6;
    options_00.generate_mutable_code = (bool)(char)((uint)uVar6 >> 8);
    options_00.generate_shared_code = (bool)(char)((uint)uVar6 >> 0x10);
    options_00.enforce_lite = (bool)(char)((uint)uVar6 >> 0x18);
    options_00._6_2_ = in_stack_fffffffffffffece;
    options_00.annotation_list_file._M_dataplus._M_p = puVar8;
    options_00.annotation_list_file._M_string_length = in_stack_fffffffffffffed8;
    options_00.annotation_list_file.field_2._M_allocated_capacity = in_stack_fffffffffffffee0;
    options_00.annotation_list_file.field_2._8_8_ = in_stack_fffffffffffffee8;
    options_00.output_list_file._M_dataplus._M_p = puVar9;
    options_00.output_list_file._M_string_length = in_stack_fffffffffffffef8;
    options_00.output_list_file.field_2._M_allocated_capacity = in_stack_ffffffffffffff00;
    options_00.output_list_file.field_2._8_8_ = in_stack_ffffffffffffff08;
    options_00.strip_nonfunctional_codegen = (bool)(char)uVar10;
    options_00.jvm_dsl = (bool)(char)((ushort)uVar10 >> 8);
    options_00._74_2_ = in_stack_ffffffffffffff12;
    options_00._76_4_ = in_stack_ffffffffffffff14;
    local_38 = uVar10;
    WriteDocCommentBodyForLocation(printer,(SourceLocation *)local_e8,options_00,SUB21(uVar10,0));
    if (local_58[0] != local_48) {
      operator_delete(local_58[0],local_48[0] + 1);
    }
    if (local_78[0] != local_68) {
      operator_delete(local_78[0],local_68[0] + 1);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_p != &local_a8) {
    operator_delete(local_b8._M_p,
                    CONCAT71(local_a8._M_allocated_capacity._1_7_,local_a8._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._16_8_ != &local_c8) {
    operator_delete((void *)local_e8._16_8_,
                    CONCAT71(local_c8._M_allocated_capacity._1_7_,local_c8._M_local_buf[0]) + 1);
  }
  if (puVar9 != &stack0xffffffffffffff00) {
    operator_delete(puVar9,in_stack_ffffffffffffff00 + 1);
  }
  if (puVar8 != &stack0xfffffffffffffee0) {
    operator_delete(puVar8,in_stack_fffffffffffffee0 + 1);
  }
  if (kdoc) {
    pcVar2 = (message->all_names_).payload_;
    pjVar5 = (java *)(ulong)*(ushort *)(pcVar2 + 2);
    input._M_len = pcVar2 + ~(ulong)pjVar5;
    input._M_str = pcVar4;
    EscapeKdoc_abi_cxx11_((string *)local_e8,pjVar5,input);
    text_00._M_str = " * Protobuf type `$fullname$`\n */\n";
    text_00._M_len = 0x22;
    io::Printer::Print<char[9],std::__cxx11::string>
              (printer,text_00,(char (*) [9])"fullname",(string *)local_e8);
  }
  else {
    pcVar2 = (message->all_names_).payload_;
    pjVar5 = (java *)(ulong)*(ushort *)(pcVar2 + 2);
    input_00._M_len = pcVar2 + ~(ulong)pjVar5;
    input_00._M_str = pcVar4;
    EscapeJavadoc_abi_cxx11_((string *)local_e8,pjVar5,input_00);
    text_01._M_str = " * Protobuf type {@code $fullname$}\n */\n";
    text_01._M_len = 0x28;
    io::Printer::Print<char[9],std::__cxx11::string>
              (printer,text_01,(char (*) [9])"fullname",(string *)local_e8);
  }
  if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
    operator_delete((void *)local_e8._0_8_,(ulong)(local_e8._16_8_ + 1));
  }
  return;
}

Assistant:

void WriteMessageDocComment(io::Printer* printer, const Descriptor* message,
                            const Options options, const bool kdoc) {
  printer->Print("/**\n");
  WriteDocCommentBody(printer, message, options, kdoc);
  if (kdoc) {
    printer->Print(
        " * Protobuf type `$fullname$`\n"
        " */\n",
        "fullname", EscapeKdoc(message->full_name()));
  } else {
    printer->Print(
        " * Protobuf type {@code $fullname$}\n"
        " */\n",
        "fullname", EscapeJavadoc(message->full_name()));
  }
}